

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O0

string * __thiscall
PcodeGenerator::GetNextTemp_abi_cxx11_(string *__return_storage_ptr__,PcodeGenerator *this)

{
  string local_78;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  PcodeGenerator *local_18;
  PcodeGenerator *this_local;
  string *str;
  
  this->m_temp_count = this->m_temp_count + 1;
  local_19 = 0;
  local_18 = this;
  this_local = (PcodeGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"t",&local_41);
  std::__cxx11::to_string(&local_78,this->m_temp_count);
  std::operator+(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

string GetNextTemp() {
        m_temp_count++;
        string str = string("t") + std::to_string(m_temp_count);
        return str;
    }